

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O1

void __thiscall
S2CellIndex::GetIntersectingLabels
          (S2CellIndex *this,S2CellUnion *target,vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  pointer piVar6;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
             ::_M_manager;
  local_38._M_unused._M_object = labels;
  VisitIntersectingCells(this,target,(CellVisitor *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar1 != piVar6) {
    uVar4 = (long)piVar6 - (long)piVar1 >> 2;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar1,piVar6,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar1,piVar6);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  piVar2 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((_Var5._M_current != piVar2) &&
     (piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     piVar6 = (pointer)((long)_Var5._M_current + ((long)piVar1 - (long)piVar2)), piVar1 != piVar6))
  {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  return;
}

Assistant:

void S2CellIndex::GetIntersectingLabels(const S2CellUnion& target,
                                        std::vector<Label>* labels) const {
  labels->clear();
  VisitIntersectingCells(target, [labels](S2CellId cell_id, Label label) {
      labels->push_back(label);
      return true;
    });
  std::sort(labels->begin(), labels->end());
  labels->erase(std::unique(labels->begin(), labels->end()), labels->end());
}